

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

bool AppInitParameterInteraction(ArgsManager *args)

{
  undefined1 *puVar1;
  CChainParams *pCVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  CChainParams *pCVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  pointer *ppbVar8;
  path *this;
  long lVar9;
  string original;
  string original_00;
  string original_01;
  pointer pbVar10;
  __index_type _Var11;
  byte bVar12;
  char cVar13;
  bool bVar14;
  bool bVar15;
  ChainType chain;
  int iVar16;
  CChainParams *pCVar17;
  undefined8 uVar18;
  _Rb_tree<BlockFilterType,_BlockFilterType,_std::_Identity<BlockFilterType>,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
  *__x;
  int64_t iVar19;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var20;
  uint uVar21;
  Options *strDefault;
  string *strDefault_00;
  uint *strDefault_01;
  uint uVar22;
  bilingual_str *fmt;
  long lVar23;
  anon_class_8_1_64ee79b3_for__M_pred __pred;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_R8;
  char *in_R9;
  long lVar24;
  long in_FS_OFFSET;
  bool bVar25;
  Span<const_unsigned_char> s;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  optional<long> oVar26;
  char *fmt_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  Notifications notifications;
  BlockFilterType filter_type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8 [3];
  Result<void> blockman_result;
  Options blockman_opts_dummy;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  __index_type local_3b0;
  Result<void> result;
  CChainParams *local_2d8 [2];
  _Base_ptr local_2c8 [2];
  CChainParams *local_2b8 [2];
  _Base_ptr local_2a8 [2];
  CChainParams *local_298 [2];
  _Base_ptr local_288 [2];
  string local_278;
  CChainParams *local_258;
  _Base_ptr local_250;
  _Base_ptr local_248 [2];
  string local_238;
  string local_218;
  string blockfilterindex_value;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  undefined1 local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  bilingual_str warnings;
  pointer *local_d8;
  pointer local_d0;
  pointer local_c8 [2];
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  bilingual_str errors;
  
  lVar9 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar17 = Params();
  chain = ArgsManager::GetChainType(args);
  if (chain == SIGNET) {
    fmt_00 = (char *)0x8af48e;
    s.m_size = 4;
    s.m_data = (pCVar17->pchMessageStart)._M_elems;
    HexStr_abi_cxx11_((string *)&result,s);
    in_R9 = "Signet derived magic (message start): %s\n";
    in_R8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x38b;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
    source_file._M_len = 0x51;
    logging_function._M_str = "AppInitParameterInteraction";
    logging_function._M_len = 0x1b;
    LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0x38b,
               IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|ESTIMATEFEE|HTTP
               |MEMPOOL|NET,(Level)(string *)&result,fmt_00,in_stack_fffffffffffffb18);
    if ((undefined1 *)
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
        (undefined1 *)
        ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
      operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_
                      ,result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1);
    }
  }
  errors.original._M_dataplus._M_p = (pointer)&errors.original.field_2;
  errors.original._M_string_length = 0;
  errors.original.field_2._M_local_buf[0] = '\0';
  errors.translated._M_dataplus._M_p = (pointer)&errors.translated.field_2;
  errors.translated._M_string_length = 0;
  errors.translated.field_2._M_local_buf[0] = '\0';
  ArgsManager::GetUnsuitableSectionOnlyArgs_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&blockman_result,args);
  if ((undefined1 *)
      blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_ !=
      (undefined1 *)
      ((long)&blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 8)) {
    pCVar2 = (CChainParams *)(local_b8 + 0x10);
    paVar3 = &blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2;
    uVar18 = blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._24_8_;
    do {
      local_b8._0_8_ = pCVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,
                 "Config setting for %s only applied on %s network when in [%s] section.","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_98._M_allocated_capacity = (size_type)&local_88;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,
                   "Config setting for %s only applied on %s network when in [%s] section.","");
      }
      else {
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2c463ad;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                   (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&names);
      }
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\n","");
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char*>((string *)&names,local_d8,local_d0 + (long)local_d8)
      ;
      local_3d0._M_allocated_capacity = (size_type)&local_3c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d0,local_d8,local_d0 + (long)local_d8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 (char *)names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (size_type)
                 names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 (char *)local_3d0._M_allocated_capacity,local_3d0._8_8_);
      blockman_opts_dummy.chainparams = (CChainParams *)&blockman_opts_dummy.prune_target;
      if ((CChainParams *)local_b8._0_8_ == pCVar2) {
        blockman_opts_dummy._24_8_ = local_b8._24_8_;
      }
      else {
        blockman_opts_dummy.chainparams = (CChainParams *)local_b8._0_8_;
      }
      blockman_opts_dummy.prune_target = CONCAT71(local_b8._17_7_,local_b8[0x10]);
      blockman_opts_dummy._8_8_ = local_b8._8_8_;
      local_b8._8_8_ = (pointer)0x0;
      local_b8[0x10] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_allocated_capacity == &local_88) {
        blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2._8_8_ = local_88._8_8_;
        blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p =
             (pointer)local_98._M_allocated_capacity;
      }
      blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2._M_allocated_capacity._1_7_ =
           local_88._M_allocated_capacity._1_7_;
      blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2._M_local_buf[0] =
           local_88._M_local_buf[0];
      blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_string_length = local_98._8_8_;
      local_98._8_8_ = 0;
      local_88._M_local_buf[0] = '\0';
      local_b8._0_8_ = pCVar2;
      local_98._M_allocated_capacity = (size_type)&local_88;
      ChainTypeToString_abi_cxx11_(&warnings.original,chain);
      in_R8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&filter_type;
      ChainTypeToString_abi_cxx11_((string *)in_R8,chain);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,
                 (bilingual_str *)(uVar18 + 0x20),&warnings.original,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&errors.original,
                 (char *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_,
                 result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&errors.translated,
                 (char *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_,
                 result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_);
      if ((undefined1 *)
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ !=
          (undefined1 *)
          ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30)) {
        operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _32_8_,
                        CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _52_4_,result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._48_4_) + 1);
      }
      if ((undefined1 *)
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
          (undefined1 *)
          ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
        operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _0_8_,
                        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_filter_type != local_4b8) {
        operator_delete((void *)_filter_type,local_4b8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)warnings.original._M_dataplus._M_p != &warnings.original.field_2) {
        operator_delete(warnings.original._M_dataplus._M_p,
                        CONCAT71(warnings.original.field_2._M_allocated_capacity._1_7_,
                                 warnings.original.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p != paVar3) {
        operator_delete(blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p,
                        blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2.
                        _M_allocated_capacity + 1);
      }
      if (blockman_opts_dummy.chainparams != (CChainParams *)&blockman_opts_dummy.prune_target) {
        operator_delete(blockman_opts_dummy.chainparams,blockman_opts_dummy.prune_target + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_allocated_capacity != &local_3c0) {
        operator_delete((void *)local_3d0._M_allocated_capacity,local_3c0._M_allocated_capacity + 1)
        ;
      }
      if (names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,(ulong)(local_c8[0] + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_allocated_capacity != &local_88) {
        operator_delete((void *)local_98._M_allocated_capacity,
                        CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1)
        ;
      }
      if ((CChainParams *)local_b8._0_8_ != pCVar2) {
        operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
      }
      uVar18 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar18);
    } while ((_Rb_tree_node_base *)uVar18 !=
             (_Rb_tree_node_base *)
             ((long)&blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&blockman_result);
  if (errors.original._M_string_length != 0) {
    bVar12 = InitError(&errors);
    goto LAB_008b0fc6;
  }
  if (chain == TESTNET) {
    in_R8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x398;
    in_R9 = (char *)0xffffffffffffffff;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init.cpp";
    source_file_00._M_len = 0x51;
    logging_function_00._M_str = "AppInitParameterInteraction";
    logging_function_00._M_len = 0x1b;
    LogPrintf_<>(logging_function_00,source_file_00,0x398,ALL,Info,
                 "Warning: Support for testnet3 is deprecated and will be removed in an upcoming release. Consider switching to testnet4.\n"
                );
  }
  warnings.original._M_dataplus._M_p = (pointer)&warnings.original.field_2;
  warnings.original._M_string_length = 0;
  warnings.original.field_2._M_local_buf[0] = '\0';
  warnings.translated._M_dataplus._M_p = (pointer)&warnings.translated.field_2;
  warnings.translated._M_string_length = 0;
  warnings.translated.field_2._M_local_buf[0] = '\0';
  ArgsManager::GetUnrecognizedSections_abi_cxx11_
            ((list<SectionInfo,_std::allocator<SectionInfo>_> *)&filter_type,args);
  uVar18 = _filter_type;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_filter_type !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&filter_type) {
    pCVar2 = (CChainParams *)(local_198 + 0x10);
    paVar3 = &local_178.field_2;
    pCVar4 = (CChainParams *)(local_158 + 0x10);
    paVar5 = &local_138.field_2;
    paVar6 = &blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2;
    do {
      local_1b8 = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"%s:%i ","");
      local_198._0_8_ = pCVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_198,local_1b8,local_1b0 + (long)local_1b8);
      local_178._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,local_1b8,local_1b0 + (long)local_1b8);
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&names,"Section [%s] is not recognized.","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_3d0._M_allocated_capacity = (size_type)&local_3c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3d0,"Section [%s] is not recognized.","");
      }
      else {
        blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
             anon_var_dwarf_2c463ef;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3d0,
                   (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&blockman_result);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 (char *)names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (size_type)
                 names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_178,(char *)local_3d0._M_allocated_capacity,local_3d0._8_8_);
      if ((CChainParams *)local_198._0_8_ == pCVar2) {
        local_158._24_4_ = local_198._24_4_;
        local_158._28_4_ = local_198._28_4_;
        local_158._0_8_ = pCVar4;
      }
      else {
        local_158._0_8_ = local_198._0_8_;
      }
      local_158._20_4_ = local_198._20_4_;
      local_158._16_4_ = local_198._16_4_;
      local_158._8_8_ = local_198._8_8_;
      local_198._8_8_ = (pointer)0x0;
      local_198._16_4_ = local_198._16_4_ & 0xffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p == paVar3) {
        local_138.field_2._8_4_ = local_178.field_2._8_4_;
        local_138.field_2._12_4_ = local_178.field_2._12_4_;
        local_138._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_138._M_dataplus._M_p = local_178._M_dataplus._M_p;
      }
      local_138.field_2._M_allocated_capacity._4_4_ = local_178.field_2._M_allocated_capacity._4_4_;
      local_138.field_2._M_allocated_capacity._0_4_ = local_178.field_2._M_allocated_capacity._0_4_;
      local_138._M_string_length = local_178._M_string_length;
      local_178._M_string_length = 0;
      local_178.field_2._M_allocated_capacity._0_4_ =
           local_178.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_1d8 = local_1c8;
      local_198._0_8_ = pCVar2;
      local_178._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"\n","");
      blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
           (long)&blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&blockman_result,local_1d8,local_1d0 + (long)local_1d8);
      blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
           (long)&blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&blockman_result.m_variant.
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20),
                 local_1d8,local_1d0 + (long)local_1d8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                 (char *)blockman_result.m_variant.
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_,
                 blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_138,
                 (char *)blockman_result.m_variant.
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_,
                 blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_);
      blockman_opts_dummy.chainparams = (CChainParams *)&blockman_opts_dummy.prune_target;
      if ((CChainParams *)local_158._0_8_ == pCVar4) {
        blockman_opts_dummy._28_4_ = local_158._28_4_;
        blockman_opts_dummy._24_4_ = local_158._24_4_;
      }
      else {
        blockman_opts_dummy.chainparams = (CChainParams *)local_158._0_8_;
      }
      blockman_opts_dummy.prune_target = local_158._16_8_;
      blockman_opts_dummy._8_8_ = local_158._8_8_;
      local_158._8_8_ = (pointer)0x0;
      local_158._16_8_ = local_158._16_8_ & 0xffffffffffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == paVar5) {
        blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2._8_8_ =
             CONCAT44(local_138.field_2._12_4_,local_138.field_2._8_4_);
        blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar6;
      }
      else {
        blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p =
             local_138._M_dataplus._M_p;
      }
      blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2._M_allocated_capacity =
           local_138.field_2._M_allocated_capacity;
      in_R8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(uVar18 + 0x10);
      blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_string_length =
           local_138._M_string_length;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity =
           local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_158._0_8_ = pCVar4;
      local_138._M_dataplus._M_p = (pointer)paVar5;
      tinyformat::format<std::__cxx11::string,int,std::__cxx11::string>
                ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,
                 (bilingual_str *)(uVar18 + 0x30),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (uVar18 + 0x50),(int *)in_R8->_M_local_buf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&warnings.original,
                 (char *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_,
                 result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&warnings.translated,
                 (char *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_,
                 result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_);
      if ((undefined1 *)
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ !=
          (undefined1 *)
          ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30)) {
        operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _32_8_,
                        CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _52_4_,result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._48_4_) + 1);
      }
      if ((undefined1 *)
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
          (undefined1 *)
          ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
        operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _0_8_,
                        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p != paVar6) {
        operator_delete(blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p,
                        blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2.
                        _M_allocated_capacity + 1);
      }
      if (blockman_opts_dummy.chainparams != (CChainParams *)&blockman_opts_dummy.prune_target) {
        operator_delete(blockman_opts_dummy.chainparams,blockman_opts_dummy.prune_target + 1);
      }
      if ((undefined1 *)
          blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ !=
          (undefined1 *)
          ((long)&blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30)) {
        operator_delete((void *)blockman_result.m_variant.
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _32_8_,
                        blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                        .super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ + 1)
        ;
      }
      if ((undefined1 *)
          blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
          (undefined1 *)
          ((long)&blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
        operator_delete((void *)blockman_result.m_variant.
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _0_8_,
                        blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                        .super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1)
        ;
      }
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar5) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((CChainParams *)local_158._0_8_ != pCVar4) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_allocated_capacity != &local_3c0) {
        operator_delete((void *)local_3d0._M_allocated_capacity,local_3c0._M_allocated_capacity + 1)
        ;
      }
      if (names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar3) {
        operator_delete(local_178._M_dataplus._M_p,
                        CONCAT44(local_178.field_2._M_allocated_capacity._4_4_,
                                 local_178.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((CChainParams *)local_198._0_8_ != pCVar2) {
        operator_delete((void *)local_198._0_8_,CONCAT44(local_198._20_4_,local_198._16_4_) + 1);
      }
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
      uVar18 = *(undefined8 *)uVar18;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uVar18 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&filter_type);
  }
  bVar12 = (byte)uVar18;
  std::__cxx11::_List_base<SectionInfo,_std::allocator<SectionInfo>_>::_M_clear
            ((_List_base<SectionInfo,_std::allocator<SectionInfo>_> *)&filter_type);
  if (warnings.original._M_string_length != 0) {
    InitWarning(&warnings);
  }
  ArgsManager::GetBlocksDirPath((path *)&result,args);
  cVar13 = std::filesystem::status((path *)&result);
  std::filesystem::__cxx11::path::~path((path *)&result);
  if (cVar13 == '\x02') {
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
         (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-blockfilterindex","");
    blockman_opts_dummy.chainparams = (CChainParams *)&blockman_opts_dummy.prune_target;
    std::__cxx11::string::_M_construct<char_const*>((string *)&blockman_opts_dummy,"0","");
    strDefault = &blockman_opts_dummy;
    ArgsManager::GetArg(&blockfilterindex_value,args,(string *)&result,(string *)strDefault);
    if (blockman_opts_dummy.chainparams != (CChainParams *)&blockman_opts_dummy.prune_target) {
      operator_delete(blockman_opts_dummy.chainparams,blockman_opts_dummy.prune_target + 1);
    }
    if ((undefined1 *)
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
        (undefined1 *)
        ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
      operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_
                      ,result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1);
    }
    iVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare(&blockfilterindex_value,"");
    if ((iVar16 != 0) &&
       (iVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(&blockfilterindex_value,"1"), iVar16 != 0)) {
      iVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(&blockfilterindex_value,"0");
      if (iVar16 == 0) goto LAB_008b03d1;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
           (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-blockfilterindex","");
      ArgsManager::GetArgs(&names,args,(string *)&result);
      if ((undefined1 *)
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
          (undefined1 *)
          ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
        operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _0_8_,
                        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1)
        ;
      }
      pbVar10 = names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      bVar25 = names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar25) {
        fmt = (bilingual_str *)
              names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar14 = BlockFilterTypeByName(&fmt->original,&filter_type);
          if (bVar14) {
            std::
            _Rb_tree<BlockFilterType,BlockFilterType,std::_Identity<BlockFilterType>,std::less<BlockFilterType>,std::allocator<BlockFilterType>>
            ::_M_insert_unique<BlockFilterType_const&>
                      ((_Rb_tree<BlockFilterType,BlockFilterType,std::_Identity<BlockFilterType>,std::less<BlockFilterType>,std::allocator<BlockFilterType>>
                        *)(anonymous_namespace)::g_enabled_filter_types,&filter_type);
          }
          else {
            blockman_opts_dummy.chainparams = (CChainParams *)&blockman_opts_dummy.prune_target;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&blockman_opts_dummy,"Unknown -blockfilterindex value %s.","");
            if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0)
            {
              blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p =
                   (pointer)&blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&blockman_opts_dummy.blocks_dir,
                         "Unknown -blockfilterindex value %s.","");
            }
            else {
              blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
                   anon_var_dwarf_2c4644c;
              (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &blockman_opts_dummy.blocks_dir,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                         (char **)&blockman_result);
            }
            tinyformat::format<std::__cxx11::string>
                      ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,fmt,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       strDefault);
            bVar15 = InitError((bilingual_str *)&result);
            uVar18 = ZEXT18(bVar15);
            if ((undefined1 *)
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ !=
                (undefined1 *)
                ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30)) {
              operator_delete((void *)result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                      _M_u._32_8_,
                              CONCAT44(result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._52_4_,
                                       result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._48_4_) + 1);
            }
            if ((undefined1 *)
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
                (undefined1 *)
                ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
              operator_delete((void *)result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                      _M_u._0_8_,
                              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                              _16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p !=
                &blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2) {
              operator_delete(blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p
                              ,blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2.
                               _M_allocated_capacity + 1);
            }
            if (blockman_opts_dummy.chainparams != (CChainParams *)&blockman_opts_dummy.prune_target
               ) {
              operator_delete(blockman_opts_dummy.chainparams,blockman_opts_dummy.prune_target + 1);
            }
          }
          bVar12 = (byte)uVar18;
          if (!bVar14) break;
          fmt = (bilingual_str *)&fmt->translated;
          bVar25 = fmt == (bilingual_str *)pbVar10;
        } while (!bVar25);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&names);
      if (bVar25) goto LAB_008b03d1;
      goto LAB_008b0f5b;
    }
    __x = &AllBlockFilterTypes()->_M_t;
    std::
    _Rb_tree<BlockFilterType,_BlockFilterType,_std::_Identity<BlockFilterType>,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
    ::operator=((_Rb_tree<BlockFilterType,_BlockFilterType,_std::_Identity<BlockFilterType>,_std::less<BlockFilterType>,_std::allocator<BlockFilterType>_>
                 *)(anonymous_namespace)::g_enabled_filter_types,__x);
LAB_008b03d1:
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
         (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-v2transport","");
    bVar25 = ArgsManager::GetBoolArg(args,(string *)&result,true);
    if ((undefined1 *)
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
        (undefined1 *)
        ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
      operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_
                      ,result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1);
    }
    if (bVar25) {
      (anonymous_namespace)::nLocalServices._1_1_ = (anonymous_namespace)::nLocalServices._1_1_ | 8;
    }
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
         (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-peerblockfilters","");
    bVar25 = ArgsManager::GetBoolArg(args,(string *)&result,false);
    if ((undefined1 *)
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
        (undefined1 *)
        ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
      operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_
                      ,result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1);
    }
    if (bVar25) {
      lVar23 = 0x13f46e0;
      for (lVar24 = (anonymous_namespace)::g_enabled_filter_types._16_8_; lVar24 != 0;
          lVar24 = *(long *)(lVar24 + 0x10)) {
        lVar23 = lVar24;
      }
      if ((lVar23 != 0x13f46e0) && (*(char *)(lVar23 + 0x20) == '\0')) {
        (anonymous_namespace)::nLocalServices._0_1_ =
             (byte)(anonymous_namespace)::nLocalServices | 0x40;
        goto LAB_008b06da;
      }
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
           (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&result,"Cannot set -peerblockfilters without -blockfilterindex.","");
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage + 0x20);
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
             (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)pbVar7,"Cannot set -peerblockfilters without -blockfilterindex.","");
      }
      else {
        blockman_opts_dummy.chainparams = (CChainParams *)anon_var_dwarf_2c4647d;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (pbVar7,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&blockman_opts_dummy);
      }
      bVar12 = InitError((bilingual_str *)&result);
LAB_008b0f13:
      if ((undefined1 *)
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ !=
          (undefined1 *)
          ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30)) {
        operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _32_8_,
                        CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _52_4_,result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._48_4_) + 1);
      }
      local_248[0] = (_Base_ptr)
                     result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_;
      uVar18 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_;
      if ((undefined1 *)
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
          (undefined1 *)
          ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
LAB_008b0f53:
        operator_delete((void *)uVar18,(ulong)((long)&local_248[0]->_M_color + 1));
      }
    }
    else {
LAB_008b06da:
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
           (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-prune","");
      iVar19 = ArgsManager::GetIntArg(args,(string *)&result,0);
      if ((undefined1 *)
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
          (undefined1 *)
          ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
        operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _0_8_,
                        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1)
        ;
      }
      if (iVar19 != 0) {
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
             (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-txindex","");
        bVar25 = ArgsManager::GetBoolArg(args,(string *)&result,false);
        if ((undefined1 *)
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
            (undefined1 *)
            ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
          operator_delete((void *)result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _0_8_,
                          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ +
                          1);
        }
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
             &result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_rest + 0x10;
        if (bVar25) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&result,"Prune mode is incompatible with -txindex.","");
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                    _M_storage._M_storage + 0x20);
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
                 (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)pbVar7,"Prune mode is incompatible with -txindex.","");
          }
          else {
            blockman_opts_dummy.chainparams = (CChainParams *)anon_var_dwarf_2c464a2;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (pbVar7,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                       (char **)&blockman_opts_dummy);
          }
          bVar12 = InitError((bilingual_str *)&result);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&result,"-reindex-chainstate","");
          bVar25 = ArgsManager::GetBoolArg(args,(string *)&result,false);
          if ((undefined1 *)
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
              (undefined1 *)
              ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
            operator_delete((void *)result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u
                                    ._0_8_,
                            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_
                            + 1);
          }
          if (!bVar25) goto LAB_008b08a5;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
               (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&result,
                     "Prune mode is incompatible with -reindex-chainstate. Use full -reindex instead."
                     ,"");
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                    _M_storage._M_storage + 0x20);
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
                 (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)pbVar7,
                       "Prune mode is incompatible with -reindex-chainstate. Use full -reindex instead."
                       ,"");
          }
          else {
            blockman_opts_dummy.chainparams = (CChainParams *)anon_var_dwarf_2c464af;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (pbVar7,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                       (char **)&blockman_opts_dummy);
          }
          bVar12 = InitError((bilingual_str *)&result);
        }
        goto LAB_008b0f13;
      }
LAB_008b08a5:
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
           (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-forcednsseed","");
      bVar25 = ArgsManager::GetBoolArg(args,(string *)&result,false);
      if (bVar25) {
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-dnsseed","");
        bVar25 = ArgsManager::GetBoolArg(args,&local_218,true);
        bVar25 = !bVar25;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar25 = false;
      }
      if ((undefined1 *)
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
          (undefined1 *)
          ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
        operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _0_8_,
                        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1)
        ;
      }
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
           &result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_rest + 0x10;
      if (bVar25) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&result,
                   "Cannot set -forcednsseed to true when setting -dnsseed to false.","");
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage + 0x20);
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
               (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)pbVar7,
                     "Cannot set -forcednsseed to true when setting -dnsseed to false.","");
        }
        else {
          blockman_opts_dummy.chainparams = (CChainParams *)anon_var_dwarf_2c464d2;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (pbVar7,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&blockman_opts_dummy
                    );
        }
        bVar12 = InitError((bilingual_str *)&result);
        goto LAB_008b0f13;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-bind","");
      ArgsManager::GetArgs(&names,args,(string *)&result);
      lVar23 = (long)names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      blockman_opts_dummy.chainparams = (CChainParams *)&blockman_opts_dummy.prune_target;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&blockman_opts_dummy,"-whitebind","");
      ArgsManager::GetArgs
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&blockman_result,args,(string *)&blockman_opts_dummy);
      lVar24 = blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_8_ -
               blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&blockman_result);
      if (blockman_opts_dummy.chainparams != (CChainParams *)&blockman_opts_dummy.prune_target) {
        operator_delete(blockman_opts_dummy.chainparams,blockman_opts_dummy.prune_target + 1);
      }
      lVar23 = (lVar24 >> 5) + (lVar23 >> 5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&names);
      if ((undefined1 *)
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
          (undefined1 *)
          ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
        operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _0_8_,
                        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1)
        ;
      }
      if (lVar23 == 0) {
        bVar25 = false;
      }
      else {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"-listen","");
        bVar25 = ArgsManager::GetBoolArg(args,&local_238,true);
        bVar25 = !bVar25;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar25) {
        local_258 = (CChainParams *)local_248;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,"Cannot set -bind or -whitebind together with -listen=0","")
        ;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
             (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&result,local_258,(long)&local_250->_M_color + (long)local_258);
        puVar1 = (undefined1 *)
                 ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ = puVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                           super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20),
                   local_258,(long)&local_250->_M_color + (long)local_258);
        bVar12 = InitError((bilingual_str *)&result);
        if ((undefined1 *)
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ != puVar1) {
          operator_delete((void *)result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _32_8_,
                          CONCAT44(result.m_variant.
                                   super__Variant_base<bilingual_str,_std::monostate>.
                                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                   _52_4_,result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._48_4_) + 1);
        }
        if ((undefined1 *)
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
            (undefined1 *)
            ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
          operator_delete((void *)result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _0_8_,
                          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ +
                          1);
        }
        uVar18 = local_258;
        if (local_258 == (CChainParams *)local_248) goto LAB_008b0f5b;
        goto LAB_008b0f53;
      }
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
           (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-listen","");
      bVar25 = ArgsManager::GetBoolArg(args,(string *)&result,true);
      if (bVar25) {
        bVar25 = false;
      }
      else {
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"-listenonion","");
        bVar25 = ArgsManager::GetBoolArg(args,&local_278,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
      }
      if ((undefined1 *)
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
          (undefined1 *)
          ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
        operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _0_8_,
                        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1)
        ;
      }
      if (bVar25 == false) {
        iVar16 = (int)lVar23 + (uint)(lVar23 == 0);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
             (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-maxconnections","");
        iVar19 = ArgsManager::GetIntArg(args,(string *)&result,0x7d);
        (anonymous_namespace)::nUserMaxConnections = (uint)iVar19;
        if ((undefined1 *)
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
            (undefined1 *)
            ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
          operator_delete((void *)result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _0_8_,
                          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ +
                          1);
        }
        (anonymous_namespace)::nMaxConnections = (anonymous_namespace)::nUserMaxConnections;
        if ((int)(anonymous_namespace)::nUserMaxConnections < 1) {
          (anonymous_namespace)::nMaxConnections = 0;
        }
        (anonymous_namespace)::nFD =
             RaiseFileDescriptorLimit(iVar16 + (anonymous_namespace)::nMaxConnections + 0x9f);
        uVar21 = ((anonymous_namespace)::nFD - iVar16) - 0x9f;
        if ((int)(anonymous_namespace)::nMaxConnections <= (int)uVar21) {
          uVar21 = (anonymous_namespace)::nMaxConnections;
        }
        strDefault_01 = (uint *)(ulong)uVar21;
        uVar22 = 0;
        if (0 < (int)uVar21) {
          uVar22 = uVar21;
        }
        if ((anonymous_namespace)::nFD < 0x96) {
          (anonymous_namespace)::nMaxConnections = uVar22;
          _((bilingual_str *)&result,(ConstevalStringLiteral)0xfc3df2);
          bVar12 = InitError((bilingual_str *)&result);
          bilingual_str::~bilingual_str((bilingual_str *)&result);
        }
        else {
          (anonymous_namespace)::nMaxConnections = (anonymous_namespace)::nFD - 0x9fU;
          if ((int)uVar22 < (int)((anonymous_namespace)::nFD - 0x9fU)) {
            (anonymous_namespace)::nMaxConnections = uVar22;
          }
          if ((int)(anonymous_namespace)::nMaxConnections <
              (int)(anonymous_namespace)::nUserMaxConnections) {
            _((bilingual_str *)&blockman_opts_dummy,(ConstevalStringLiteral)0xfc3e19);
            strDefault_01 = &(anonymous_namespace)::nMaxConnections;
            tinyformat::format<int,int>
                      ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,
                       (bilingual_str *)&(anonymous_namespace)::nUserMaxConnections,
                       (int *)&(anonymous_namespace)::nMaxConnections,(int *)in_R8->_M_local_buf);
            InitWarning((bilingual_str *)&result);
            bilingual_str::~bilingual_str((bilingual_str *)&result);
            bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
          }
          init::SetLoggingCategories(&result,args);
          _Var11 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index;
          if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index != '\x01') {
            util::ErrorString<void>((bilingual_str *)&blockman_opts_dummy,&result);
            bVar12 = InitError((bilingual_str *)&blockman_opts_dummy);
            bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
          }
          std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
          ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
          if (_Var11 == '\x01') {
            init::SetLoggingLevel(&result,args);
            if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index != '\x01') {
              util::ErrorString<void>((bilingual_str *)&blockman_opts_dummy,&result);
              bVar12 = InitError((bilingual_str *)&blockman_opts_dummy);
              bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
            }
            std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
            ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
            if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index == '\x01') {
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
                   (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-timeout","");
              iVar19 = ArgsManager::GetIntArg(args,(string *)&result,5000);
              nConnectTimeout = (int)iVar19;
              if ((undefined1 *)
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
                  (undefined1 *)
                  ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10))
              {
                operator_delete((void *)result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._0_8_,
                                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _16_8_ + 1);
              }
              if (nConnectTimeout < 1) {
                nConnectTimeout = 5000;
              }
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
                   (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-peertimeout","");
              (anonymous_namespace)::peer_connect_timeout =
                   ArgsManager::GetIntArg(args,(string *)&result,0x3c);
              if ((undefined1 *)
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
                  (undefined1 *)
                  ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10))
              {
                operator_delete((void *)result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._0_8_,
                                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _16_8_ + 1);
              }
              if ((anonymous_namespace)::peer_connect_timeout < 1) {
                local_2b8[0] = (CChainParams *)local_2a8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2b8,"peertimeout must be a positive integer.","");
                original_00._M_string_length = (size_type)args;
                original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb18;
                original_00.field_2._M_allocated_capacity = (size_type)pCVar17;
                original_00.field_2._8_8_ = notifications._vptr_Notifications;
                Untranslated((bilingual_str *)&result,original_00);
                bVar12 = InitError((bilingual_str *)&result);
                bilingual_str::~bilingual_str((bilingual_str *)&result);
                local_248[0] = local_2a8[0];
                uVar18 = local_2b8[0];
                if (local_2b8[0] != (CChainParams *)local_2a8) goto LAB_008b0f53;
              }
              else {
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
                     (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&result,"-blockmintxfee","");
                bVar25 = ArgsManager::IsArgSet(args,(string *)&result);
                if ((undefined1 *)
                    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
                    (undefined1 *)
                    ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)
                   ) {
                  operator_delete((void *)result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._0_8_,
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _16_8_ + 1);
                }
                if (bVar25) {
                  blockman_opts_dummy.chainparams =
                       (CChainParams *)&blockman_opts_dummy.prune_target;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&blockman_opts_dummy,"-blockmintxfee","");
                  ppbVar8 = &names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&names,"");
                  strDefault_01 = (uint *)&names;
                  ArgsManager::GetArg((string *)&result,args,(string *)&blockman_opts_dummy,
                                      (string *)strDefault_01);
                  oVar26 = ParseMoney((string *)&result);
                  if ((undefined1 *)
                      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
                      (undefined1 *)
                      ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u +
                      0x10)) {
                    operator_delete((void *)result.m_variant.
                                            super__Variant_base<bilingual_str,_std::monostate>.
                                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Variant_storage_alias<bilingual_str,_std::monostate>
                                            ._M_u._0_8_,
                                    result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u
                                    ._16_8_ + 1);
                  }
                  if (names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar8) {
                    operator_delete(names.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (ulong)((long)&((names.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + 1));
                  }
                  if (blockman_opts_dummy.chainparams !=
                      (CChainParams *)&blockman_opts_dummy.prune_target) {
                    operator_delete(blockman_opts_dummy.chainparams,
                                    blockman_opts_dummy.prune_target + 1);
                  }
                  if (((undefined1  [16])
                       oVar26.super__Optional_base<long,_true,_true>._M_payload.
                       super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) {
                    blockman_opts_dummy.chainparams =
                         (CChainParams *)&blockman_opts_dummy.prune_target;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&blockman_opts_dummy,"blockmintxfee","");
                    puVar1 = (undefined1 *)
                             ((long)&blockman_result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u + 0x10);
                    blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = puVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&blockman_result,"-blockmintxfee","");
                    _filter_type = local_4b8;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&filter_type,"");
                    ArgsManager::GetArg((string *)&names,args,(string *)&blockman_result,
                                        (string *)&filter_type);
                    common::AmountErrMsg
                              ((bilingual_str *)&result,(string *)&blockman_opts_dummy,
                               (string *)&names);
                    bVar12 = InitError((bilingual_str *)&result);
                    bilingual_str::~bilingual_str((bilingual_str *)&result);
                    if (names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar8) {
                      operator_delete(names.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (ulong)((long)&((names.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_filter_type != local_4b8) {
                      operator_delete((void *)_filter_type,local_4b8[0]._M_allocated_capacity + 1);
                    }
                    if ((undefined1 *)
                        blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                        .super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
                        puVar1) {
                      operator_delete((void *)blockman_result.m_variant.
                                              super__Variant_base<bilingual_str,_std::monostate>.
                                              super__Move_assign_alias<bilingual_str,_std::monostate>
                                              .
                                              super__Copy_assign_alias<bilingual_str,_std::monostate>
                                              .super__Move_ctor_alias<bilingual_str,_std::monostate>
                                              .super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                              .
                                              super__Variant_storage_alias<bilingual_str,_std::monostate>
                                              ._M_u._0_8_,
                                      blockman_result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                      _M_u._16_8_ + 1);
                    }
                    local_248[0] = (_Base_ptr)blockman_opts_dummy.prune_target;
                    uVar18 = blockman_opts_dummy.chainparams;
                    if (blockman_opts_dummy.chainparams !=
                        (CChainParams *)&blockman_opts_dummy.prune_target) goto LAB_008b0f53;
                    goto LAB_008b0f5b;
                  }
                }
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
                     (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&result,"-bytespersigop","");
                iVar19 = ArgsManager::GetIntArg(args,(string *)&result,(ulong)nBytesPerSigOp);
                nBytesPerSigOp = (uint)iVar19;
                if ((undefined1 *)
                    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
                    (undefined1 *)
                    ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)
                   ) {
                  operator_delete((void *)result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._0_8_,
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _16_8_ + 1);
                }
                iVar16 = (*g_wallet_init_interface->_vptr_WalletInitInterface[2])();
                if ((char)iVar16 == '\0') {
                  bVar12 = 0;
                }
                else {
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
                       (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u +
                       0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-mocktime","");
                  iVar19 = ArgsManager::GetIntArg(args,(string *)&result,0);
                  SetMockTime(iVar19);
                  if ((undefined1 *)
                      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
                      (undefined1 *)
                      ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u +
                      0x10)) {
                    operator_delete((void *)result.m_variant.
                                            super__Variant_base<bilingual_str,_std::monostate>.
                                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Variant_storage_alias<bilingual_str,_std::monostate>
                                            ._M_u._0_8_,
                                    result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u
                                    ._16_8_ + 1);
                  }
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
                       (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u +
                       0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&result,"-peerbloomfilters","");
                  bVar25 = ArgsManager::GetBoolArg(args,(string *)&result,false);
                  if ((undefined1 *)
                      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
                      (undefined1 *)
                      ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u +
                      0x10)) {
                    operator_delete((void *)result.m_variant.
                                            super__Variant_base<bilingual_str,_std::monostate>.
                                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Variant_storage_alias<bilingual_str,_std::monostate>
                                            ._M_u._0_8_,
                                    result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u
                                    ._16_8_ + 1);
                  }
                  if (bVar25) {
                    (anonymous_namespace)::nLocalServices._0_1_ =
                         (byte)(anonymous_namespace)::nLocalServices | 4;
                  }
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
                       (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u +
                       0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-test","");
                  bVar25 = ArgsManager::IsArgSet(args,(string *)&result);
                  if ((undefined1 *)
                      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
                      (undefined1 *)
                      ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u +
                      0x10)) {
                    operator_delete((void *)result.m_variant.
                                            super__Variant_base<bilingual_str,_std::monostate>.
                                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Variant_storage_alias<bilingual_str,_std::monostate>
                                            ._M_u._0_8_,
                                    result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u
                                    ._16_8_ + 1);
                  }
                  if (bVar25) {
                    if (pCVar17->m_chain_type != REGTEST) {
                      local_2d8[0] = (CChainParams *)local_2c8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2d8,"-test=<option> can only be used with regtest",
                                 "");
                      original_01._M_string_length = (size_type)args;
                      original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb18;
                      original_01.field_2._M_allocated_capacity = (size_type)pCVar17;
                      original_01.field_2._8_8_ = notifications._vptr_Notifications;
                      Untranslated((bilingual_str *)&result,original_01);
                      bVar12 = InitError((bilingual_str *)&result);
                      bilingual_str::~bilingual_str((bilingual_str *)&result);
                      local_248[0] = local_2c8[0];
                      uVar18 = local_2d8[0];
                      if (local_2d8[0] != (CChainParams *)local_2c8) goto LAB_008b0f53;
                      goto LAB_008b0f5b;
                    }
                    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ =
                         (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u +
                         0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&result,"-test","");
                    ArgsManager::GetArgs(&names,args,(string *)&result);
                    if ((undefined1 *)
                        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
                        (undefined1 *)
                        ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u +
                        0x10)) {
                      operator_delete((void *)result.m_variant.
                                              super__Variant_base<bilingual_str,_std::monostate>.
                                              super__Move_assign_alias<bilingual_str,_std::monostate>
                                              .
                                              super__Copy_assign_alias<bilingual_str,_std::monostate>
                                              .super__Move_ctor_alias<bilingual_str,_std::monostate>
                                              .super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                              .
                                              super__Variant_storage_alias<bilingual_str,_std::monostate>
                                              ._M_u._0_8_,
                                      result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                      _M_u._16_8_ + 1);
                    }
                    if (names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      __pred.option =
                           names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      do {
                        _Var20 = std::
                                 find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,AppInitParameterInteraction(ArgsManager_const&)::__0>
                                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             )TEST_OPTIONS_DOC_abi_cxx11_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             )TEST_OPTIONS_DOC_abi_cxx11_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish,__pred);
                        if (_Var20._M_current ==
                            TEST_OPTIONS_DOC_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          _((bilingual_str *)&blockman_opts_dummy,(ConstevalStringLiteral)0xfc3eea);
                          tinyformat::format<std::__cxx11::string>
                                    ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,
                                     (bilingual_str *)__pred.option,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)strDefault_01);
                          InitWarning((bilingual_str *)&result);
                          bilingual_str::~bilingual_str((bilingual_str *)&result);
                          bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
                        }
                        __pred.option = __pred.option + 1;
                      } while (__pred.option !=
                               names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&names);
                  }
                  notifications._vptr_Notifications = (_func_int **)&PTR__Notifications_013d9788;
                  this = (path *)(result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _M_first._M_storage._M_storage + 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = pCVar17;
                  ArgsManager::GetDataDir((path *)this,args,true);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._52_4_ =
                       result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._52_4_ &
                       0xffffff00;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x38] = '\x01';
                  node::ApplyArgsManOptions((Result<void> *)&names,args,(Options *)&result);
                  if (local_3b0 == '\x01') {
                    blockman_opts_dummy.chainparams =
                         (CChainParams *)
                         result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_;
                    blockman_opts_dummy.use_xor = true;
                    blockman_opts_dummy.prune_target = 0;
                    blockman_opts_dummy._24_8_ = blockman_opts_dummy._24_8_ & 0xffffffffffffff00;
                    ArgsManager::GetBlocksDirPath(&blockman_opts_dummy.blocks_dir,args);
                    blockman_opts_dummy.notifications = &notifications;
                    node::ApplyArgsManOptions(&blockman_result,args,&blockman_opts_dummy);
                    bVar12 = true;
                    if (blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                        .super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index !=
                        '\x01') {
                      util::ErrorString<void>((bilingual_str *)&filter_type,&blockman_result);
                      bVar12 = InitError((bilingual_str *)&filter_type);
                      bilingual_str::~bilingual_str((bilingual_str *)&filter_type);
                    }
                    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>
                    ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)
                                        &blockman_result);
                    std::filesystem::__cxx11::path::~path
                              (&blockman_opts_dummy.blocks_dir.super_path);
                  }
                  else {
                    util::ErrorString<void>
                              ((bilingual_str *)&blockman_opts_dummy,(Result<void> *)&names);
                    bVar12 = InitError((bilingual_str *)&blockman_opts_dummy);
                    bilingual_str::~bilingual_str((bilingual_str *)&blockman_opts_dummy);
                  }
                  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
                  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&names
                                   );
                  std::filesystem::__cxx11::path::~path(this);
                }
              }
            }
          }
        }
      }
      else {
        local_298[0] = (CChainParams *)local_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_298,"Cannot set -listen=0 together with -listenonion=1","");
        original._M_string_length = (size_type)args;
        original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb18;
        original.field_2._M_allocated_capacity = (size_type)pCVar17;
        original.field_2._8_8_ = notifications._vptr_Notifications;
        Untranslated((bilingual_str *)&result,original);
        bVar12 = InitError((bilingual_str *)&result);
        bilingual_str::~bilingual_str((bilingual_str *)&result);
        local_248[0] = local_288[0];
        uVar18 = local_298[0];
        if (local_298[0] != (CChainParams *)local_288) goto LAB_008b0f53;
      }
    }
LAB_008b0f5b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)blockfilterindex_value._M_dataplus._M_p != &blockfilterindex_value.field_2)
    goto LAB_008b0f74;
  }
  else {
    blockman_opts_dummy.chainparams = (CChainParams *)&blockman_opts_dummy.prune_target;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&blockman_opts_dummy,"Specified blocks directory \"%s\" does not exist.",""
              );
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p =
           (pointer)&blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&blockman_opts_dummy.blocks_dir,
                 "Specified blocks directory \"%s\" does not exist.","");
    }
    else {
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2c463fc;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &blockman_opts_dummy.blocks_dir,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                 (char **)&names);
    }
    puVar1 = (undefined1 *)
             ((long)&blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10);
    blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&blockman_result,"-blocksdir","");
    _filter_type = local_4b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&filter_type,"");
    strDefault_00 = (string *)&filter_type;
    ArgsManager::GetArg((string *)&names,args,(string *)&blockman_result,strDefault_00);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)&result,(tinyformat *)&blockman_opts_dummy,(bilingual_str *)&names,
               strDefault_00);
    bVar12 = InitError((bilingual_str *)&result);
    if ((undefined1 *)
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ !=
        (undefined1 *)
        ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30)) {
      operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                              _32_8_,
                      CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                               super__Move_assign_alias<bilingual_str,_std::monostate>.
                               super__Copy_assign_alias<bilingual_str,_std::monostate>.
                               super__Move_ctor_alias<bilingual_str,_std::monostate>.
                               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                               _52_4_,result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                      _M_u._48_4_) + 1);
    }
    if ((undefined1 *)
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ !=
        (undefined1 *)
        ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10)) {
      operator_delete((void *)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_
                      ,result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1);
    }
    if (names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((names.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_filter_type != local_4b8) {
      operator_delete((void *)_filter_type,local_4b8[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)
        blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_ != puVar1) {
      operator_delete((void *)blockman_result.m_variant.
                              super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._0_8_
                      ,blockman_result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p !=
        &blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2) {
      operator_delete(blockman_opts_dummy.blocks_dir.super_path._M_pathname._M_dataplus._M_p,
                      blockman_opts_dummy.blocks_dir.super_path._M_pathname.field_2.
                      _M_allocated_capacity + 1);
    }
    blockfilterindex_value.field_2._M_allocated_capacity = blockman_opts_dummy.prune_target;
    blockfilterindex_value._M_dataplus._M_p = (pointer)blockman_opts_dummy.chainparams;
    if (blockman_opts_dummy.chainparams != (CChainParams *)&blockman_opts_dummy.prune_target) {
LAB_008b0f74:
      operator_delete(blockfilterindex_value._M_dataplus._M_p,
                      blockfilterindex_value.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)warnings.translated._M_dataplus._M_p != &warnings.translated.field_2) {
    operator_delete(warnings.translated._M_dataplus._M_p,
                    CONCAT71(warnings.translated.field_2._M_allocated_capacity._1_7_,
                             warnings.translated.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)warnings.original._M_dataplus._M_p != &warnings.original.field_2) {
    operator_delete(warnings.original._M_dataplus._M_p,
                    CONCAT71(warnings.original.field_2._M_allocated_capacity._1_7_,
                             warnings.original.field_2._M_local_buf[0]) + 1);
  }
LAB_008b0fc6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)errors.translated._M_dataplus._M_p != &errors.translated.field_2) {
    operator_delete(errors.translated._M_dataplus._M_p,
                    CONCAT71(errors.translated.field_2._M_allocated_capacity._1_7_,
                             errors.translated.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)errors.original._M_dataplus._M_p != &errors.original.field_2) {
    operator_delete(errors.original._M_dataplus._M_p,
                    CONCAT71(errors.original.field_2._M_allocated_capacity._1_7_,
                             errors.original.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar9) {
    return (bool)(bVar12 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool AppInitParameterInteraction(const ArgsManager& args)
{
    const CChainParams& chainparams = Params();
    // ********************************************************* Step 2: parameter interactions

    // also see: InitParameterInteraction()

    // Error if network-specific options (-addnode, -connect, etc) are
    // specified in default section of config file, but not overridden
    // on the command line or in this chain's section of the config file.
    ChainType chain = args.GetChainType();
    if (chain == ChainType::SIGNET) {
        LogPrintf("Signet derived magic (message start): %s\n", HexStr(chainparams.MessageStart()));
    }
    bilingual_str errors;
    for (const auto& arg : args.GetUnsuitableSectionOnlyArgs()) {
        errors += strprintf(_("Config setting for %s only applied on %s network when in [%s] section.") + Untranslated("\n"), arg, ChainTypeToString(chain), ChainTypeToString(chain));
    }

    if (!errors.empty()) {
        return InitError(errors);
    }

    // Testnet3 deprecation warning
    if (chain == ChainType::TESTNET) {
        LogInfo("Warning: Support for testnet3 is deprecated and will be removed in an upcoming release. Consider switching to testnet4.\n");
    }

    // Warn if unrecognized section name are present in the config file.
    bilingual_str warnings;
    for (const auto& section : args.GetUnrecognizedSections()) {
        warnings += strprintf(Untranslated("%s:%i ") + _("Section [%s] is not recognized.") + Untranslated("\n"), section.m_file, section.m_line, section.m_name);
    }

    if (!warnings.empty()) {
        InitWarning(warnings);
    }

    if (!fs::is_directory(args.GetBlocksDirPath())) {
        return InitError(strprintf(_("Specified blocks directory \"%s\" does not exist."), args.GetArg("-blocksdir", "")));
    }

    // parse and validate enabled filter types
    std::string blockfilterindex_value = args.GetArg("-blockfilterindex", DEFAULT_BLOCKFILTERINDEX);
    if (blockfilterindex_value == "" || blockfilterindex_value == "1") {
        g_enabled_filter_types = AllBlockFilterTypes();
    } else if (blockfilterindex_value != "0") {
        const std::vector<std::string> names = args.GetArgs("-blockfilterindex");
        for (const auto& name : names) {
            BlockFilterType filter_type;
            if (!BlockFilterTypeByName(name, filter_type)) {
                return InitError(strprintf(_("Unknown -blockfilterindex value %s."), name));
            }
            g_enabled_filter_types.insert(filter_type);
        }
    }

    // Signal NODE_P2P_V2 if BIP324 v2 transport is enabled.
    if (args.GetBoolArg("-v2transport", DEFAULT_V2_TRANSPORT)) {
        nLocalServices = ServiceFlags(nLocalServices | NODE_P2P_V2);
    }

    // Signal NODE_COMPACT_FILTERS if peerblockfilters and basic filters index are both enabled.
    if (args.GetBoolArg("-peerblockfilters", DEFAULT_PEERBLOCKFILTERS)) {
        if (g_enabled_filter_types.count(BlockFilterType::BASIC) != 1) {
            return InitError(_("Cannot set -peerblockfilters without -blockfilterindex."));
        }

        nLocalServices = ServiceFlags(nLocalServices | NODE_COMPACT_FILTERS);
    }

    if (args.GetIntArg("-prune", 0)) {
        if (args.GetBoolArg("-txindex", DEFAULT_TXINDEX))
            return InitError(_("Prune mode is incompatible with -txindex."));
        if (args.GetBoolArg("-reindex-chainstate", false)) {
            return InitError(_("Prune mode is incompatible with -reindex-chainstate. Use full -reindex instead."));
        }
    }

    // If -forcednsseed is set to true, ensure -dnsseed has not been set to false
    if (args.GetBoolArg("-forcednsseed", DEFAULT_FORCEDNSSEED) && !args.GetBoolArg("-dnsseed", DEFAULT_DNSSEED)){
        return InitError(_("Cannot set -forcednsseed to true when setting -dnsseed to false."));
    }

    // -bind and -whitebind can't be set when not listening
    size_t nUserBind = args.GetArgs("-bind").size() + args.GetArgs("-whitebind").size();
    if (nUserBind != 0 && !args.GetBoolArg("-listen", DEFAULT_LISTEN)) {
        return InitError(Untranslated("Cannot set -bind or -whitebind together with -listen=0"));
    }

    // if listen=0, then disallow listenonion=1
    if (!args.GetBoolArg("-listen", DEFAULT_LISTEN) && args.GetBoolArg("-listenonion", DEFAULT_LISTEN_ONION)) {
        return InitError(Untranslated("Cannot set -listen=0 together with -listenonion=1"));
    }

    // Make sure enough file descriptors are available
    int nBind = std::max(nUserBind, size_t(1));
    nUserMaxConnections = args.GetIntArg("-maxconnections", DEFAULT_MAX_PEER_CONNECTIONS);
    nMaxConnections = std::max(nUserMaxConnections, 0);

    nFD = RaiseFileDescriptorLimit(nMaxConnections + MIN_CORE_FILEDESCRIPTORS + MAX_ADDNODE_CONNECTIONS + nBind + NUM_FDS_MESSAGE_CAPTURE);

#ifdef USE_POLL
    int fd_max = nFD;
#else
    int fd_max = FD_SETSIZE;
#endif
    // Trim requested connection counts, to fit into system limitations
    // <int> in std::min<int>(...) to work around FreeBSD compilation issue described in #2695
    nMaxConnections = std::max(std::min<int>(nMaxConnections, fd_max - nBind - MIN_CORE_FILEDESCRIPTORS - MAX_ADDNODE_CONNECTIONS - NUM_FDS_MESSAGE_CAPTURE), 0);
    if (nFD < MIN_CORE_FILEDESCRIPTORS)
        return InitError(_("Not enough file descriptors available."));
    nMaxConnections = std::min(nFD - MIN_CORE_FILEDESCRIPTORS - MAX_ADDNODE_CONNECTIONS - NUM_FDS_MESSAGE_CAPTURE, nMaxConnections);

    if (nMaxConnections < nUserMaxConnections)
        InitWarning(strprintf(_("Reducing -maxconnections from %d to %d, because of system limitations."), nUserMaxConnections, nMaxConnections));

    // ********************************************************* Step 3: parameter-to-internal-flags
    if (auto result{init::SetLoggingCategories(args)}; !result) return InitError(util::ErrorString(result));
    if (auto result{init::SetLoggingLevel(args)}; !result) return InitError(util::ErrorString(result));

    nConnectTimeout = args.GetIntArg("-timeout", DEFAULT_CONNECT_TIMEOUT);
    if (nConnectTimeout <= 0) {
        nConnectTimeout = DEFAULT_CONNECT_TIMEOUT;
    }

    peer_connect_timeout = args.GetIntArg("-peertimeout", DEFAULT_PEER_CONNECT_TIMEOUT);
    if (peer_connect_timeout <= 0) {
        return InitError(Untranslated("peertimeout must be a positive integer."));
    }

    // Sanity check argument for min fee for including tx in block
    // TODO: Harmonize which arguments need sanity checking and where that happens
    if (args.IsArgSet("-blockmintxfee")) {
        if (!ParseMoney(args.GetArg("-blockmintxfee", ""))) {
            return InitError(AmountErrMsg("blockmintxfee", args.GetArg("-blockmintxfee", "")));
        }
    }

    nBytesPerSigOp = args.GetIntArg("-bytespersigop", nBytesPerSigOp);

    if (!g_wallet_init_interface.ParameterInteraction()) return false;

    // Option to startup with mocktime set (used for regression testing):
    SetMockTime(args.GetIntArg("-mocktime", 0)); // SetMockTime(0) is a no-op

    if (args.GetBoolArg("-peerbloomfilters", DEFAULT_PEERBLOOMFILTERS))
        nLocalServices = ServiceFlags(nLocalServices | NODE_BLOOM);

    if (args.IsArgSet("-test")) {
        if (chainparams.GetChainType() != ChainType::REGTEST) {
            return InitError(Untranslated("-test=<option> can only be used with regtest"));
        }
        const std::vector<std::string> options = args.GetArgs("-test");
        for (const std::string& option : options) {
            auto it = std::find_if(TEST_OPTIONS_DOC.begin(), TEST_OPTIONS_DOC.end(), [&option](const std::string& doc_option) {
                size_t pos = doc_option.find(" (");
                return (pos != std::string::npos) && (doc_option.substr(0, pos) == option);
            });
            if (it == TEST_OPTIONS_DOC.end()) {
                InitWarning(strprintf(_("Unrecognised option \"%s\" provided in -test=<option>."), option));
            }
        }
    }

    // Also report errors from parsing before daemonization
    {
        kernel::Notifications notifications{};
        ChainstateManager::Options chainman_opts_dummy{
            .chainparams = chainparams,
            .datadir = args.GetDataDirNet(),
            .notifications = notifications,
        };
        auto chainman_result{ApplyArgsManOptions(args, chainman_opts_dummy)};
        if (!chainman_result) {
            return InitError(util::ErrorString(chainman_result));
        }
        BlockManager::Options blockman_opts_dummy{
            .chainparams = chainman_opts_dummy.chainparams,
            .blocks_dir = args.GetBlocksDirPath(),
            .notifications = chainman_opts_dummy.notifications,
        };
        auto blockman_result{ApplyArgsManOptions(args, blockman_opts_dummy)};
        if (!blockman_result) {
            return InitError(util::ErrorString(blockman_result));
        }
    }

    return true;
}